

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_get_batchable(TRANSFER_HANDLE transfer,_Bool *batchable_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  TRANSFER_INSTANCE *transfer_instance;
  uint32_t item_count;
  int result;
  _Bool *batchable_value_local;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1fc5;
  }
  else {
    _item_count = batchable_value;
    batchable_value_local = (_Bool *)transfer;
    iVar1 = amqpvalue_get_composite_item_count
                      (transfer->composite_value,(uint32_t *)&transfer_instance);
    if (iVar1 == 0) {
      if ((uint)transfer_instance < 0xb) {
        *_item_count = false;
        transfer_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(transfer->composite_value,10);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = false;
          transfer_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            transfer_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = false;
              transfer_instance._4_4_ = 0;
            }
            else {
              transfer_instance._4_4_ = 0x1fe6;
            }
          }
        }
      }
    }
    else {
      transfer_instance._4_4_ = 0x1fcd;
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int transfer_get_batchable(TRANSFER_HANDLE transfer, bool* batchable_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        if (amqpvalue_get_composite_item_count(transfer_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 10)
            {
                *batchable_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(transfer_instance->composite_value, 10);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *batchable_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, batchable_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *batchable_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}